

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curveproxy.cpp
# Opt level: O2

bool __thiscall
ON_CurveProxy::GetNextDiscontinuity
          (ON_CurveProxy *this,continuity c,double t0,double t1,double *t,int *hint,int *dtype,
          double cos_angle_tolerance,double curvature_tolerance)

{
  bool bVar1;
  continuity cVar2;
  int iVar3;
  double dVar4;
  int realcrv_dtype;
  double s;
  int local_6c;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (dtype != (int *)0x0) {
    *dtype = 0;
  }
  if (this->m_real_curve == (ON_Curve *)0x0) {
    return false;
  }
  local_68 = t1;
  local_60 = t0;
  local_50 = cos_angle_tolerance;
  local_48 = curvature_tolerance;
  local_58 = RealCurveParameter(this,t0);
  local_38 = RealCurveParameter(this,local_68);
  cVar2 = ON::ParametricContinuity(c);
  local_6c = 0;
  iVar3 = (*(this->m_real_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x36])
                    (local_58,local_38,local_50,local_48,this->m_real_curve,(ulong)cVar2,&local_40,
                     hint);
  if ((char)iVar3 != '\0') {
    dVar4 = ThisCurveParameter(this,local_40);
    if (((dVar4 <= local_60) || (local_68 <= dVar4)) && ((dVar4 <= local_68 || (local_60 <= dVar4)))
       ) {
      local_6c = 0;
      dVar4 = local_38 * 1.490116119385e-08 + local_58 * 0.9999999850988388;
      if ((((dVar4 <= local_58) || (local_38 <= dVar4)) &&
          ((dVar4 <= local_38 || (local_58 <= dVar4)))) ||
         (iVar3 = (*(this->m_real_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x36])
                            (dVar4,local_38,local_50,local_48,this->m_real_curve,(ulong)cVar2,
                             &local_40,hint,&local_6c), (char)iVar3 == '\0')) goto LAB_00456769;
      dVar4 = ThisCurveParameter(this,local_40);
    }
    if (((local_60 < dVar4) && (dVar4 < local_68)) || ((local_68 < dVar4 && (dVar4 < local_60)))) {
      *t = dVar4;
      if (dtype != (int *)0x0) {
        *dtype = local_6c;
        return true;
      }
      return true;
    }
  }
LAB_00456769:
  if (cVar2 == c) {
    return false;
  }
  bVar1 = ON_Curve::GetNextDiscontinuity
                    (&this->super_ON_Curve,c,local_60,local_68,t,hint,dtype,local_50,local_48);
  return bVar1;
}

Assistant:

bool ON_CurveProxy::GetNextDiscontinuity( 
                ON::continuity c,
                double t0,
                double t1,
                double* t,
                int* hint,
                int* dtype,
                double cos_angle_tolerance,
                double curvature_tolerance
                ) const
{
  bool rc = false;
  if ( 0 != dtype )
    *dtype = 0;

  if ( 0 != m_real_curve )
  {
    double s;

    // convert to "real" curve parameters
    double s0 = RealCurveParameter( t0 );
    double s1 = RealCurveParameter( t1 );

    // 21 October 2005 Dale Lear:
    //
    // NOTE: If m_bReversed is true, then RealCurveParameter
    //       will reverse the direction of the search.
    //       The commented out code below just messed things up.
    //
    //if ( m_bReversed )
    //{
    //  // NOTE: GetNextDiscontinuity search begins at 
    //  //       "t0" and goes towards "t1" so it is ok if s0 > s1.
    //  s = s0; s0 = s1; s1 = s;
    //}

    ON::continuity parametric_c = ON::ParametricContinuity((int)c);

    int realcrv_dtype = 0;
    bool realcrv_rc = m_real_curve->GetNextDiscontinuity(parametric_c,s0,s1,&s,hint,&realcrv_dtype,cos_angle_tolerance,curvature_tolerance);

    if ( realcrv_rc ) 
    {
      double thiscrv_t = ThisCurveParameter(s);
      if ( !(t0 < thiscrv_t && thiscrv_t < t1) && !(t1 < thiscrv_t && thiscrv_t < t0) )
      {
        realcrv_rc = false;
        realcrv_dtype = 0;
        // Sometimes proxy domain adjustments kill all the precision.
        // To avoid infinite loops, it is critical that *t != t0
        double s2 = ON_SQRT_EPSILON*s1 + (1.0 - ON_SQRT_EPSILON)*s0;
        if ( (s0 < s2 && s2 < s1) || (s1 < s2 && s2 < s0) )
        {
          realcrv_rc = m_real_curve->GetNextDiscontinuity(parametric_c,s2,s1,&s,hint,&realcrv_dtype,cos_angle_tolerance,curvature_tolerance);
          if ( realcrv_rc )
            thiscrv_t = ThisCurveParameter(s);
        }
      }
      if ( realcrv_rc )
      {
        if ( (t0 < thiscrv_t && thiscrv_t < t1) || (t1 < thiscrv_t && thiscrv_t < t0) )
        {
          *t = thiscrv_t;
          if ( dtype )
            *dtype = realcrv_dtype;
          rc = true;
        }
      }
    }

    if ( !rc && parametric_c != c )
    {
      // 20 March 2003 Dale Lear:
      //   Let base class test decide locus continuity questions at ends 
      rc = ON_Curve::GetNextDiscontinuity( c, t0, t1, t, hint, dtype, cos_angle_tolerance, curvature_tolerance );
    }
  }

  return rc;
}